

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t read_uncompressed_direct(exr_decode_pipeline_t *decode)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long in_RDI;
  exr_coding_channel_info_t *decc;
  int c;
  int y;
  exr_const_context_t ctxt;
  uint8_t *cdata;
  uint64_t toread;
  uint64_t dataoffset;
  int start_y;
  int height;
  exr_result_t rv;
  int local_48;
  int local_44;
  void *local_38;
  undefined8 local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  exr_result_t local_4;
  
  pcVar1 = *(char **)(in_RDI + 0x18);
  if (pcVar1 == (char *)0x0) {
    local_4 = 2;
  }
  else if (*pcVar1 == '\0') {
    if ((*(int *)(in_RDI + 0x14) < 0) || (*(int *)(pcVar1 + 0xc4) <= *(int *)(in_RDI + 0x14))) {
      local_4 = (**(code **)(pcVar1 + 0x48))
                          (pcVar1,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0x14));
    }
    else {
      local_28 = *(undefined8 *)(in_RDI + 0x38);
      local_18 = *(int *)(in_RDI + 0x2c);
      local_1c = *(int *)(in_RDI + 0x28);
      local_10 = in_RDI;
      for (local_44 = 0; local_44 < local_18; local_44 = local_44 + 1) {
        for (local_48 = 0; local_48 < *(short *)(local_10 + 0x10); local_48 = local_48 + 1) {
          lVar2 = *(long *)(local_10 + 8) + (long)local_48 * 0x30;
          if (*(int *)(lVar2 + 8) != 0) {
            if (*(int *)(lVar2 + 0x14) < 2) {
              lVar3 = (long)local_44 * (long)*(int *)(lVar2 + 0x24);
            }
            else {
              if ((local_1c + local_44) % *(int *)(lVar2 + 0x14) != 0) goto LAB_00154d1e;
              lVar3 = (long)(local_44 / *(int *)(lVar2 + 0x14)) * (long)*(int *)(lVar2 + 0x24);
            }
            local_38 = (void *)(lVar3 + *(long *)(lVar2 + 0x28));
            local_14 = (**(code **)(pcVar1 + 0x28))
                                 (pcVar1,local_38,
                                  (long)*(int *)(lVar2 + 0xc) * (long)*(char *)(lVar2 + 0x19),
                                  &local_28,0,0);
            if (local_14 != 0) {
              return local_14;
            }
            if (*(char *)(lVar2 + 0x19) == '\x02') {
              priv_to_native16(local_38,*(int *)(lVar2 + 0xc));
            }
            else {
              priv_to_native32(local_38,*(int *)(lVar2 + 0xc));
            }
          }
LAB_00154d1e:
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = (**(code **)(pcVar1 + 0x38))(pcVar1,7);
  }
  return local_4;
}

Assistant:

static exr_result_t
read_uncompressed_direct (exr_decode_pipeline_t* decode)
{
    exr_result_t        rv;
    int                 height, start_y;
    uint64_t            dataoffset, toread;
    uint8_t*            cdata;
    exr_const_context_t ctxt = decode->context;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    if (ctxt->mode != EXR_CONTEXT_READ)
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_READ);
    if (decode->part_index < 0 || decode->part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            decode->part_index);

    dataoffset = decode->chunk.data_offset;

    height  = decode->chunk.height;
    start_y = decode->chunk.start_y;
    for (int y = 0; y < height; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            toread =
                (uint64_t) decc->width * (uint64_t) decc->bytes_per_element;

            if (decc->height == 0) continue;

            if (decc->y_samples > 1)
            {
                if (((start_y + y) % decc->y_samples) != 0) continue;
                cdata +=
                    ((uint64_t) (y / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else { cdata += (uint64_t) y * (uint64_t) decc->user_line_stride; }

            /* actual read into the output pointer */
            rv = ctxt->do_read (
                ctxt, cdata, toread, &dataoffset, NULL, EXR_MUST_READ_ALL);
            if (rv != EXR_ERR_SUCCESS) return rv;

            // need to swab them to native
            if (decc->bytes_per_element == 2)
                priv_to_native16 (cdata, decc->width);
            else
                priv_to_native32 (cdata, decc->width);
        }
    }

    return EXR_ERR_SUCCESS;
}